

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O1

void __thiscall
toml::
result<std::pair<toml::string,_toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::cleanup(result<std::pair<toml::string,_toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,EVP_PKEY_CTX *ctx)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  if (this->is_ok_ == true) {
    success<std::pair<toml::string,_toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~success(&(this->field_1).succ);
    return;
  }
  pcVar1 = (this->field_1).fail.value._M_dataplus._M_p;
  paVar2 = &(this->field_1).fail.value.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

void cleanup() noexcept
    {
        if(this->is_ok_) {this->succ.~success_type();}
        else             {this->fail.~failure_type();}
        return;
    }